

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  stbtt__buf fontdict;
  bool bVar2;
  stbtt_uint32 sVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  undefined1 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uchar *puVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  stbtt__buf b;
  stbtt__buf sVar32;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  undefined4 uVar33;
  uint uStack_230;
  int iStack_22c;
  int iVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  ulong uVar37;
  undefined1 local_1f8 [16];
  long local_1e8;
  float fStack_1e0;
  int local_1dc;
  float s [48];
  stbtt__buf local_f0;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar14 = (info->subrs).data;
  local_f0.cursor = (info->subrs).cursor;
  local_f0.size = (info->subrs).size;
  sVar32 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar22 = sVar32._8_8_;
  uVar33 = sVar32.data._0_4_;
  iVar18 = sVar32.data._4_4_;
  iStack_22c = sVar32.size;
  if (iStack_22c <= sVar32.cursor) {
switchD_00191e3f_default:
    return 0;
  }
  local_f0.data = puVar14;
  lVar11 = (long)glyph_index + 1;
  local_e0 = &(info->gsubrs).cursor;
  bVar2 = true;
  iVar5 = 0;
  uVar37 = 0;
  iVar34 = 0;
  uVar20 = 0;
  local_1e8 = lVar11;
  local_1dc = glyph_index;
LAB_00191a90:
  fVar23 = s[0xb];
  fVar31 = s[10];
  fVar27 = s[8];
  fVar30 = s[5];
  fVar29 = s[3];
  fVar24 = s[1];
  uVar8 = (uint)uVar22;
  uStack_230 = uVar8 + 1;
  bVar1 = *(byte *)(CONCAT44(iVar18,uVar33) + (long)(int)uVar8);
  uVar28 = (uint)uVar20;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar5 = iVar5 + ((int)((int)(uVar20 >> 0x1f) + uVar28) >> 1);
    goto LAB_00192707;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00191ac1_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_00191bcf;
  case 0x1c:
    if (((int)uStack_230 < 1) || (iStack_22c < (int)uVar8)) {
LAB_00192742:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/stb_truetype.h"
                    ,1000,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    sVar3 = stbtt__cff_int((stbtt__buf *)&stack0xfffffffffffffdc8);
    fVar23 = (float)(int)(short)sVar3;
    uStack_230 = uVar8;
LAB_00191c12:
    if (0x2f < (int)uVar28) {
      return 0;
    }
    s[(int)uVar28] = fVar23;
    uVar21 = (ulong)(uVar28 + 1);
    break;
  case 4:
    if ((int)uVar28 < 1) {
      return 0;
    }
    fVar23 = s[uVar28 - 1];
    fVar24 = 0.0;
    goto LAB_00192109;
  case 5:
    if ((int)uVar28 < 2) {
      return 0;
    }
    uVar22 = 1;
    do {
      fVar23 = s[uVar22];
      fVar24 = s[uVar22 - 1] + c->x;
      c->x = fVar24;
      fVar23 = fVar23 + c->y;
      c->y = fVar23;
      uVar21 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar24,(int)fVar23,0,0,0,0);
      uVar22 = uVar22 + 2;
    } while (uVar22 < uVar20);
    break;
  case 6:
    iVar12 = 0;
    if ((int)uVar28 < 1) {
      return 0;
    }
    for (; iVar12 < (int)uVar28; iVar12 = iVar12 + 1) {
      fVar23 = s[iVar12] + c->x;
      c->x = fVar23;
      fVar24 = c->y + 0.0;
      c->y = fVar24;
      stbtt__csctx_v(c,'\x02',(int)fVar23,(int)fVar24,0,0,0,0);
      iVar12 = iVar12 + 1;
LAB_001926b2:
      if ((int)uVar28 <= iVar12) break;
      fVar23 = s[iVar12];
      fVar24 = c->x + 0.0;
      c->x = fVar24;
      fVar23 = fVar23 + c->y;
      c->y = fVar23;
      stbtt__csctx_v(c,'\x02',(int)fVar24,(int)fVar23,0,0,0,0);
    }
    goto LAB_00192707;
  case 7:
    iVar12 = 0;
    if (0 < (int)uVar28) goto LAB_001926b2;
    return 0;
  case 8:
    if ((int)uVar28 < 6) {
      return 0;
    }
    uVar22 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)(local_1f8 + uVar22 * 4 + 0xc),(&fStack_1e0)[uVar22 - 2],
                 (&fStack_1e0)[uVar22 - 1],(&fStack_1e0)[uVar22],s[uVar22 - 1],s[uVar22]);
      uVar22 = uVar22 + 6;
    } while (uVar22 < uVar20);
    goto LAB_00192707;
  case 10:
    iVar12 = 1;
    if (iVar34 == 0) {
      uVar8 = (info->fdselect).size;
      if (uVar8 != 0) {
        if ((int)uVar8 < 0) goto LAB_00192742;
        puVar14 = (info->fdselect).data;
        if (*puVar14 == '\0') {
          if (uVar8 < (uint)lVar11) goto LAB_00192742;
          uVar13 = 0;
          if ((int)(uint)lVar11 < (int)uVar8) {
            uVar13 = (uint)puVar14[lVar11];
          }
        }
        else {
          if (*puVar14 == '\x03') {
            uVar9 = 0;
            iVar12 = 1;
            iVar34 = 2;
            do {
              if (iVar12 < (int)uVar8) {
                lVar16 = (long)iVar12;
                iVar12 = iVar12 + 1;
                uVar13 = (uint)puVar14[lVar16];
              }
              else {
                uVar13 = 0;
              }
              uVar9 = uVar9 << 8 | uVar13;
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
            uVar15 = 0;
            iVar34 = 2;
            do {
              if (iVar12 < (int)uVar8) {
                lVar16 = (long)iVar12;
                iVar12 = iVar12 + 1;
                uVar13 = (uint)puVar14[lVar16];
              }
              else {
                uVar13 = 0;
              }
              uVar15 = uVar15 << 8 | uVar13;
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
            if (0 < (int)uVar9) {
              uVar17 = 0;
              do {
                if (iVar12 < (int)uVar8) {
                  lVar11 = (long)iVar12;
                  iVar12 = iVar12 + 1;
                  uVar13 = (uint)puVar14[lVar11];
                }
                else {
                  uVar13 = 0;
                }
                uVar19 = 0;
                iVar34 = 2;
                do {
                  if (iVar12 < (int)uVar8) {
                    lVar11 = (long)iVar12;
                    iVar12 = iVar12 + 1;
                    uVar10 = (uint)puVar14[lVar11];
                  }
                  else {
                    uVar10 = 0;
                  }
                  uVar19 = uVar19 << 8 | uVar10;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
                lVar11 = local_1e8;
                if (local_1dc < (int)uVar19 && (int)uVar15 <= local_1dc) goto LAB_00192447;
                uVar17 = uVar17 + 1;
                uVar15 = uVar19;
              } while (uVar17 != uVar9);
            }
          }
          uVar13 = 0xffffffff;
        }
LAB_00192447:
        puVar14 = (info->cff).data;
        uVar35 = SUB84(puVar14,0);
        uVar36 = (undefined4)((ulong)puVar14 >> 0x20);
        stbtt__cff_index_get(info->fontdicts,uVar13);
        sVar32.data._4_4_ = in_stack_fffffffffffffdc4;
        sVar32.data._0_4_ = in_stack_fffffffffffffdc0;
        sVar32.cursor = uVar33;
        sVar32.size = iVar18;
        fontdict.data._4_4_ = uVar36;
        fontdict.data._0_4_ = uVar35;
        fontdict.cursor = (int)uVar37;
        fontdict.size = (int)(uVar37 >> 0x20);
        local_f0 = stbtt__get_subrs(sVar32,fontdict);
        iVar12 = 1;
      }
    }
    goto LAB_00192492;
  case 0xb:
    if ((int)uVar37 < 1) {
      return 0;
    }
    uVar37 = (ulong)((int)uVar37 - 1);
    uVar33 = *(undefined4 *)&subr_stack[uVar37].data;
    iVar18 = *(int *)((long)&subr_stack[uVar37].data + 4);
    uStack_230 = subr_stack[uVar37].cursor;
    iStack_22c = subr_stack[uVar37].size;
    uVar21 = uVar20;
    break;
  case 0xc:
    lVar16 = (long)(int)uStack_230;
    uVar7 = 0;
    if ((int)uStack_230 < iStack_22c) {
      uStack_230 = uVar8 + 2;
      uVar7 = *(undefined1 *)(CONCAT44(iVar18,uVar33) + lVar16);
    }
    fVar26 = s[7];
    fVar25 = s[6];
    switch(uVar7) {
    case 0x22:
      if ((int)uVar28 < 7) {
        return 0;
      }
      local_1f8 = ZEXT416((uint)s[2]);
      fVar25 = s[4];
      fVar31 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar24 = -(float)local_1f8._0_4_;
      fVar26 = 0.0;
      fVar23 = 0.0;
      in_stack_fffffffffffffdc0 = fVar25;
      in_stack_fffffffffffffdc4 = fVar31;
      break;
    case 0x23:
      if ((int)uVar28 < 0xd) {
        return 0;
      }
      local_1f8._0_4_ = s[9];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar30 = fVar27;
      fVar24 = (float)local_1f8._0_4_;
      in_stack_fffffffffffffdc0 = fVar26;
      in_stack_fffffffffffffdc4 = fVar25;
      break;
    case 0x24:
      if ((int)uVar28 < 9) {
        return 0;
      }
      local_1f8._0_4_ = s[7];
      fVar30 = s[6];
      fVar25 = s[5];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar23 = -(fVar24 + fVar29 + (float)local_1f8._0_4_);
      fVar26 = 0.0;
      fVar24 = (float)local_1f8._0_4_;
      fVar31 = fVar27;
      in_stack_fffffffffffffdc0 = fVar30;
      in_stack_fffffffffffffdc4 = fVar25;
      break;
    case 0x25:
      if ((int)uVar28 < 0xb) {
        return 0;
      }
      fVar29 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar30 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar24 = ABS(fVar29);
      fVar31 = ABS(fVar30);
      local_1f8._0_4_ = s[9];
      fVar23 = s[10];
      if (fVar31 < fVar24) {
        fVar23 = -fVar30;
      }
      uVar8 = -(uint)(fVar31 < fVar24);
      uVar28 = (uint)s[10] & uVar8;
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar30 = fVar27;
      fVar24 = (float)local_1f8._0_4_;
      fVar31 = (float)(~uVar8 & (uint)-fVar29 | uVar28);
      in_stack_fffffffffffffdc0 = fVar26;
      in_stack_fffffffffffffdc4 = fVar25;
      break;
    default:
      goto switchD_00191e3f_default;
    }
    goto LAB_00191de7;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar2) {
      iVar5 = iVar5 + ((int)((int)(uVar20 >> 0x1f) + uVar28) >> 1);
    }
    iVar12 = iVar5 + 0xe;
    if (-1 < iVar5 + 7) {
      iVar12 = iVar5 + 7;
    }
    uStack_230 = (iVar12 >> 3) + uStack_230;
    if (((int)uStack_230 < 0) || (iStack_22c < (int)uStack_230)) goto LAB_00192742;
    goto LAB_00192141;
  case 0x15:
    if ((int)uVar28 < 2) {
      return 0;
    }
    fVar24 = s[uVar28 - 2];
    fVar23 = s[uVar28 - 1];
    goto LAB_00192109;
  case 0x16:
    if ((int)uVar28 < 1) {
      return 0;
    }
    fVar24 = s[uVar28 - 1];
    fVar23 = 0.0;
LAB_00192109:
    stbtt__csctx_rmove_to(c,fVar24,fVar23);
LAB_00192141:
    bVar2 = false;
    uVar21 = 0;
    break;
  case 0x18:
    if ((int)uVar28 < 8) {
      return 0;
    }
    lVar16 = -6;
    do {
      lVar4 = lVar16;
      stbtt__csctx_rccurve_to
                (c,s[lVar4 + 6],s[lVar4 + 7],s[lVar4 + 8],s[lVar4 + 9],s[lVar4 + 10],s[lVar4 + 0xb])
      ;
      lVar11 = local_1e8;
      lVar16 = lVar4 + 6;
    } while (lVar4 + 6 < (long)(int)uVar28 + -0xd);
    if ((int)uVar28 <= (int)lVar4 + 0xd) {
      return 0;
    }
    fVar23 = s[lVar4 + 0xd];
    fVar24 = s[lVar4 + 0xc] + c->x;
    c->x = fVar24;
    fVar23 = fVar23 + c->y;
    c->y = fVar23;
    stbtt__csctx_v(c,'\x02',(int)fVar24,(int)fVar23,0,0,0,0);
    uVar21 = 0;
    break;
  case 0x19:
    if ((int)uVar28 < 8) {
      return 0;
    }
    lVar16 = 5;
    do {
      lVar4 = lVar16;
      fVar23 = (&fStack_1e0)[lVar4 + -2];
      fVar24 = *(float *)(local_1f8 + lVar4 * 4 + 0xc) + c->x;
      c->x = fVar24;
      fVar23 = fVar23 + c->y;
      c->y = fVar23;
      stbtt__csctx_v(c,'\x02',(int)fVar24,(int)fVar23,0,0,0,0);
      lVar16 = lVar4 + 2;
    } while (lVar4 + -2 < (long)(int)(uVar28 - 6));
    if ((int)uVar28 <= (int)lVar16) {
      return 0;
    }
    fVar25 = *(float *)(local_1f8 + lVar16 * 4 + 0xc);
    fVar26 = (&fStack_1e0)[lVar4];
    fVar23 = s[lVar16];
    lVar11 = local_1e8;
    fVar30 = (&fStack_1e0)[lVar4 + 1];
    fVar24 = (&fStack_1e0)[lVar16];
    fVar31 = s[lVar4 + 1];
LAB_00191de7:
    stbtt__csctx_rccurve_to(c,fVar25,fVar26,fVar30,fVar24,fVar31,fVar23);
    goto LAB_00192707;
  case 0x1a:
  case 0x1b:
    if ((int)uVar28 < 4) {
      return 0;
    }
    uVar22 = (ulong)(uVar28 & 1);
    if ((int)((uVar28 & 1) + 3) < (int)uVar28) {
      fVar23 = 0.0;
      if ((uVar20 & 1) != 0) {
        fVar23 = s[0];
      }
      do {
        iVar12 = (int)uVar22;
        fVar24 = s[uVar22];
        fVar29 = s[iVar12 + 3];
        if (bVar1 == 0x1b) {
          fVar30 = fVar24;
          fVar24 = fVar23;
          fVar27 = fVar29;
          fVar29 = 0.0;
        }
        else {
          fVar27 = 0.0;
          fVar30 = fVar23;
        }
        stbtt__csctx_rccurve_to(c,fVar30,fVar24,s[uVar22 + 1],s[uVar22 + 2],fVar27,fVar29);
        uVar22 = uVar22 + 4;
        fVar23 = 0.0;
      } while (iVar12 + 7 < (int)uVar28);
    }
    goto LAB_00192707;
  case 0x1d:
    iVar12 = iVar34;
LAB_00192492:
    if ((int)uVar28 < 1) {
      return 0;
    }
    iVar34 = (int)uVar37;
    if (9 < iVar34) {
      return 0;
    }
    fVar23 = s[uVar28 - 1];
    *(undefined4 *)&subr_stack[iVar34].data = uVar33;
    *(int *)((long)&subr_stack[iVar34].data + 4) = iVar18;
    subr_stack[iVar34].cursor = uStack_230;
    subr_stack[iVar34].size = iStack_22c;
    piVar6 = &local_f0.cursor;
    puVar14 = local_f0.data;
    if (bVar1 != 10) {
      puVar14 = (info->gsubrs).data;
      piVar6 = local_e0;
    }
    uVar22 = *(ulong *)piVar6;
    if ((long)uVar22 < 0) goto LAB_00192742;
    uVar37 = (ulong)(iVar34 + 1);
    uVar13 = 0;
    iVar18 = 2;
    uVar8 = 0;
    do {
      if ((int)uVar13 < (int)(uVar22 >> 0x20)) {
        lVar16 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        uVar9 = (uint)puVar14[lVar16];
      }
      else {
        uVar9 = 0;
      }
      uVar8 = uVar8 << 8 | uVar9;
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
    uVar9 = (uint)(0x4d7 < (int)uVar8) << 10 | 0x6b;
    if (0x846b < (int)uVar8) {
      uVar9 = 0x8000;
    }
    iVar18 = uVar9 + (int)fVar23;
    sVar32 = (stbtt__buf)ZEXT816(0);
    if (iVar18 < (int)uVar8 && -1 < iVar18) {
      b._8_8_ = (ulong)uVar13 | uVar22 & 0x7fffffff00000000;
      b.data = puVar14;
      sVar32 = stbtt__cff_index_get(b,iVar18);
    }
    uVar33 = sVar32.data._0_4_;
    iVar18 = sVar32.data._4_4_;
    iStack_22c = sVar32.size;
    if (iStack_22c == 0) {
      return 0;
    }
    uStack_230 = 0;
    uVar21 = (ulong)(uVar28 - 1);
    iVar34 = iVar12;
    break;
  case 0x1e:
    iVar12 = 0;
    if ((int)uVar28 < 4) {
      return 0;
    }
    for (; iVar12 + 3 < (int)uVar28; iVar12 = iVar12 + 4) {
      fVar23 = 0.0;
      if (uVar28 - iVar12 == 5) {
        fVar23 = s[(long)iVar12 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar12],s[(long)iVar12 + 1],s[(long)iVar12 + 2],s[iVar12 + 3],fVar23);
      iVar12 = iVar12 + 4;
LAB_00192609:
      if ((int)uVar28 <= iVar12 + 3) break;
      fVar23 = 0.0;
      if (uVar28 - iVar12 == 5) {
        fVar23 = s[(long)iVar12 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar12],0.0,s[(long)iVar12 + 1],s[(long)iVar12 + 2],fVar23,s[iVar12 + 3]);
    }
LAB_00192707:
    uVar21 = 0;
    break;
  case 0x1f:
    iVar12 = 0;
    if (3 < (int)uVar28) goto LAB_00192609;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_00191ac1_caseD_2;
LAB_00191bcf:
    uVar8 = 0;
    iVar12 = 4;
    do {
      if ((int)uStack_230 < iStack_22c) {
        lVar16 = (long)(int)uStack_230;
        uStack_230 = uStack_230 + 1;
        uVar13 = (uint)*(byte *)(CONCAT44(iVar18,uVar33) + lVar16);
      }
      else {
        uVar13 = 0;
      }
      uVar8 = uVar8 << 8 | uVar13;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    fVar23 = (float)uVar8 * 1.5258789e-05;
    goto LAB_00191c12;
  }
  uVar22 = (ulong)uStack_230;
  uVar20 = uVar21;
  if (iStack_22c <= (int)uStack_230) {
    return 0;
  }
  goto LAB_00191a90;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}